

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# clipper.cpp
# Opt level: O2

void __thiscall ClipperLib::Clipper::InsertScanbeam(Clipper *this,long64 Y)

{
  Scanbeam *pSVar1;
  Scanbeam *pSVar2;
  
  pSVar2 = this->m_Scanbeam;
  if (pSVar2 == (Scanbeam *)0x0) {
    pSVar2 = (Scanbeam *)operator_new(0x10);
    this->m_Scanbeam = pSVar2;
    pSVar2->next = (Scanbeam *)0x0;
    pSVar2->Y = Y;
  }
  else if (pSVar2->Y < Y) {
    pSVar1 = (Scanbeam *)operator_new(0x10);
    pSVar1->Y = Y;
    pSVar1->next = pSVar2;
    this->m_Scanbeam = pSVar1;
  }
  else {
    do {
      pSVar1 = pSVar2;
      pSVar2 = pSVar1->next;
      if (pSVar2 == (Scanbeam *)0x0) break;
    } while (Y <= pSVar2->Y);
    if (pSVar1->Y != Y) {
      pSVar2 = (Scanbeam *)operator_new(0x10);
      pSVar2->Y = Y;
      pSVar2->next = pSVar1->next;
      pSVar1->next = pSVar2;
    }
  }
  return;
}

Assistant:

void Clipper::InsertScanbeam(const long64 Y)
{
  if( !m_Scanbeam )
  {
    m_Scanbeam = new Scanbeam;
    m_Scanbeam->next = 0;
    m_Scanbeam->Y = Y;
  }
  else if(  Y > m_Scanbeam->Y )
  {
    Scanbeam* newSb = new Scanbeam;
    newSb->Y = Y;
    newSb->next = m_Scanbeam;
    m_Scanbeam = newSb;
  } else
  {
    Scanbeam* sb2 = m_Scanbeam;
    while( sb2->next  && ( Y <= sb2->next->Y ) ) sb2 = sb2->next;
    if(  Y == sb2->Y ) return; //ie ignores duplicates
    Scanbeam* newSb = new Scanbeam;
    newSb->Y = Y;
    newSb->next = sb2->next;
    sb2->next = newSb;
  }
}